

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_live_fetching.c
# Opt level: O2

int main(void)

{
  long lVar1;
  aspa_array *paVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t i;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  rtr_mgr_config *conf;
  rtr_socket rtr_tcp;
  tr_tcp_config local_e8;
  tr_socket tr_tcp;
  char RPKI_CACHE_PORT [5];
  rtr_mgr_group groups [1];
  char RPKI_CACHE_HOST [22];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.host = RPKI_CACHE_HOST;
  builtin_strncpy(RPKI_CACHE_HOST,"rtrlab.tanneberger.me",0x16);
  local_e8.port = RPKI_CACHE_PORT;
  builtin_strncpy(RPKI_CACHE_PORT,"3325",5);
  local_e8.bindaddr = (char *)0x0;
  local_e8.data._0_4_ = 0;
  local_e8.data._4_4_ = 0;
  local_e8.new_socket._0_4_ = 0;
  local_e8._36_8_ = 0;
  tr_tcp_init(&local_e8,&tr_tcp);
  rtr_tcp.tr_socket = &tr_tcp;
  groups[0].sockets = (rtr_socket **)malloc(8);
  groups[0].sockets_len = 1;
  *groups[0].sockets = &rtr_tcp;
  groups[0].preference = '\x01';
  iVar5 = 1;
  iVar4 = rtr_mgr_init(&conf,groups,1,connection_status_callback,(void *)0x0);
  if (-1 < iVar4) {
    iVar4 = rtr_mgr_add_roa_support(conf,(pfx_update_fp)0x0);
    if (iVar4 == -1) {
      fwrite("Failed initializing ROA support\n",0x20,1,_stderr);
    }
    iVar4 = rtr_mgr_add_aspa_support(conf,(aspa_update_fp)0x0);
    if (iVar4 == -1) {
      fwrite("Failed initializing ASPA support\n",0x21,1,_stderr);
    }
    iVar4 = rtr_mgr_add_spki_support(conf,(spki_update_fp)0x0);
    if (iVar4 == -1) {
      fwrite("Failed initializing BGPSEC support\n",0x23,1,_stderr);
    }
    iVar5 = 1;
    rtr_mgr_setup_sockets(conf,groups,1,0x32,600,600);
    rtr_mgr_start(conf);
    iVar4 = 0x14;
    do {
      _Var3 = rtr_mgr_conf_in_sync(conf);
      if (_Var3) {
        paVar2 = (*groups[0].sockets)->aspa_table->store->aspa_array;
        puts("ASPA:");
        for (uVar6 = 0; uVar6 < paVar2->size; uVar6 = uVar6 + 1) {
          uVar7 = 0;
          printf("CAS %u => [ ",(ulong)paVar2->data[uVar6].customer_asn);
          while( true ) {
            uVar8 = (ulong)uVar7;
            if (paVar2->data[uVar6].provider_count <= uVar8) break;
            printf("%u",(ulong)paVar2->data[uVar6].provider_asns[uVar8]);
            if (uVar8 < paVar2->data[uVar6].provider_count - 1) {
              printf(", ");
            }
            uVar7 = uVar7 + 1;
          }
          puts(" ]");
        }
        rtr_mgr_stop(conf);
        rtr_mgr_free(conf);
        iVar5 = 0;
        break;
      }
      if (connection_status == RTR_MGR_ERROR) break;
      sleep(1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int main(void)
{
	/* These variables are not in the global scope
	 * because it would cause warnings about discarding constness
	 */

	//char RPKI_CACHE_HOST[] = "rpki-validator.realmv6.org";
	//char RPKI_CACHE_PORT[] = "8283";

	// REPLACE THIS BY YOUR RTR SERVER
	char RPKI_CACHE_HOST[] = "rtrlab.tanneberger.me";
	char RPKI_CACHE_PORT[] = "3325"; // rir rtr
	//char RPKI_CACHE_PORT[] = "3324"; // aspa rtr

	/* create a TCP transport socket */
	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {RPKI_CACHE_HOST, RPKI_CACHE_PORT, NULL, NULL, NULL, 0};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mgr_group array with 1 element */
	groups[0].sockets = malloc(1 * sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	struct rtr_mgr_config *conf;

	if (rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL) < 0)
		return EXIT_FAILURE;

	if (rtr_mgr_add_roa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);
	rtr_mgr_start(conf);
	int sleep_counter = 0;
	/* wait for connection, or timeout and exit eventually */
	while (!rtr_mgr_conf_in_sync(conf)) {
		if (connection_status == RTR_MGR_ERROR)
			return EXIT_FAILURE;

		sleep(1);
		sleep_counter++;
		if (sleep_counter >= connection_timeout)
			return EXIT_FAILURE;
	}

	/* printing all fetched objects */
	struct aspa_array *array = ((*groups[0].sockets)->aspa_table->store)->aspa_array;

	printf("ASPA:\n");
	for (uint32_t i = 0; i < array->size; i++) {
		printf("CAS %u => [ ", array->data[i].customer_asn);
		for (uint32_t j = 0; j < array->data[i].provider_count; j++) {
			printf("%u", array->data[i].provider_asns[j]);
			if (j < array->data[i].provider_count - 1)
				printf(", ");
		}
		printf(" ]\n");
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);

	return EXIT_SUCCESS;
}